

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O1

report * __thiscall
picobench::runner::generate_report<std::equal_to<long>>(report *__return_storage_ptr__,runner *this)

{
  pointer *ppbVar1;
  iterator __position;
  pointer pbVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  size_t sVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  pointer psVar8;
  iterator __end5;
  state *state;
  pointer pbVar9;
  _Base_ptr p_Var10;
  benchmark_problem_space *d;
  _Base_ptr p_Var11;
  pointer pbVar12;
  iterator __begin5;
  pointer prVar13;
  map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  psview;
  char local_a9;
  _Base_ptr local_a8;
  report *local_a0;
  pointer local_98;
  _Base_ptr local_90;
  _Rb_tree<int,_std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
  local_88;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->suites).
           super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->suites).
           super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->suites).
  super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->suites).
  super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = __return_storage_ptr__;
  std::vector<picobench::report::suite,_std::allocator<picobench::report::suite>_>::resize
            (&__return_storage_ptr__->suites,
             (long)(this->super_registry)._suites.
                   super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->super_registry)._suites.
                   super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl
                   .super__Vector_impl_data._M_start >> 5);
  prVar13 = (this->super_registry)._suites.
            super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = (this->super_registry)._suites.
             super__Vector_base<picobench::rsuite,_std::allocator<picobench::rsuite>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (prVar13 != local_58) {
    psVar8 = (local_a0->suites).
             super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (_Base_ptr)&this->_default_state_iterations;
    do {
      psVar8->name = prVar13->name;
      local_48 = psVar8;
      std::vector<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>::
      resize(&psVar8->benchmarks,
             (long)(prVar13->benchmarks).
                   super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(prVar13->benchmarks).
                   super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
      p_Var7 = (_Base_ptr)
               (prVar13->benchmarks).
               super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (_Base_ptr)
                 (prVar13->benchmarks).
                 super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_50 = prVar13;
      if (p_Var7 != local_38) {
        pbVar9 = (psVar8->benchmarks).
                 super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar9->name = *(char **)*(_Base_ptr *)p_Var7;
          p_Var10 = *(_Base_ptr *)p_Var7;
          pbVar9->is_baseline = *(bool *)&p_Var10->_M_left;
          p_Var11 = p_Var10 + 1;
          if (*(_Base_ptr *)(p_Var10 + 1) == p_Var10[1]._M_parent) {
            p_Var11 = local_40;
          }
          std::
          vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
          ::reserve(&pbVar9->data,(long)p_Var11->_M_parent - *(long *)p_Var11 >> 2);
          p_Var10 = p_Var11->_M_parent;
          for (p_Var11 = *(_Base_ptr *)p_Var11; p_Var11 != p_Var10;
              p_Var11 = (_Base_ptr)&p_Var11->field_0x4) {
            local_88._M_impl._0_4_ = p_Var11->_M_color;
            local_88._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
            local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_88._M_impl._4_4_ = 0;
            __position._M_current =
                 *(pointer *)
                  ((long)&(pbVar9->data).
                          super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                          ._M_impl + 8);
            if (__position._M_current ==
                *(pointer *)
                 ((long)&(pbVar9->data).
                         super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                         ._M_impl + 0x10)) {
              std::
              vector<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
              ::_M_realloc_insert<picobench::report::benchmark_problem_space>
                        (&pbVar9->data,__position,(benchmark_problem_space *)&local_88);
            }
            else {
              (__position._M_current)->result = 0;
              (__position._M_current)->dimension = local_88._M_impl._0_4_;
              (__position._M_current)->samples = 0;
              (__position._M_current)->total_time_ns = 0;
              ppbVar1 = (pointer *)
                        ((long)&(pbVar9->data).
                                super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                                ._M_impl + 8);
              *ppbVar1 = *ppbVar1 + 1;
            }
          }
          p_Var10 = *(_Base_ptr *)(*(_Base_ptr *)p_Var7 + 2);
          local_90 = (*(_Base_ptr *)p_Var7)[2]._M_parent;
          local_a8 = p_Var7;
          local_98 = pbVar9;
          if (p_Var10 != local_90) {
            do {
              pbVar2 = *(pointer *)
                        ((long)&(local_98->data).
                                super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                                ._M_impl + 8);
              for (pbVar12 = (local_98->data).
                             super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
                  pbVar12 = pbVar12 + 1) {
                if (*(int *)&p_Var10->_M_right == pbVar12->dimension) {
                  if ((pbVar12->total_time_ns == 0) ||
                     ((long)p_Var10->_M_parent < pbVar12->total_time_ns)) {
                    pbVar12->total_time_ns = (int64_t)p_Var10->_M_parent;
                    pbVar12->result = *(result_t *)(p_Var10 + 1);
                  }
                  if ((this->_compare_results_across_samples == true) &&
                     (pbVar12->result != *(long *)(p_Var10 + 1))) {
                    poVar6 = this->_stderr;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,"Error: Two samples of ",0x16);
                    pcVar3 = *(char **)*(_Base_ptr *)local_a8;
                    if (pcVar3 == (char *)0x0) {
                      std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
                    }
                    else {
                      sVar5 = strlen(pcVar3);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar5);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," @",2);
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pbVar12->dimension);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6," produced different results: ",0x1d);
                    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," and ",5);
                    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                    local_88._M_impl._0_1_ = 10;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_88,1);
                    this->_error = error_sample_compare;
                  }
                  pbVar12->samples = pbVar12->samples + 1;
                }
              }
              p_Var10 = (_Base_ptr)&p_Var10[1]._M_parent;
            } while (p_Var10 != local_90);
          }
          pbVar9 = local_98 + 1;
          p_Var7 = (_Base_ptr)&local_a8->_M_parent;
        } while (p_Var7 != local_38);
      }
      psVar8 = local_48 + 1;
      prVar13 = local_50 + 1;
    } while (prVar13 != local_58);
  }
  if (this->_compare_results_across_benchmarks != false) {
    local_98 = (pointer)(local_a0->suites).
                        super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    local_90 = (_Base_ptr)
               (local_a0->suites).
               super__Vector_base<picobench::report::suite,_std::allocator<picobench::report::suite>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_98 != (pointer)local_90) {
      do {
        report::get_problem_space_view
                  ((map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
                    *)&local_88,(suite *)local_98);
        for (p_Var7 = local_88._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &local_88._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          p_Var10 = p_Var7[1]._M_parent;
          p_Var11 = p_Var7[1]._M_left;
          if ((long)p_Var11 - (long)p_Var10 == 0x20) {
            poVar6 = this->_stdwarn;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Warning: Benchmark ",0x13);
            pcVar3 = *(char **)p_Var10;
            if (pcVar3 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
            }
            else {
              sVar5 = strlen(pcVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar5);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," @",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,p_Var7[1]._M_color);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," has a single instance and cannot be compared to others.\n",0x39);
          }
          else if (p_Var10 != p_Var11) {
            local_a8 = p_Var10->_M_right;
            do {
              if (local_a8 != p_Var10->_M_right) {
                p_Var4 = p_Var7[1]._M_parent;
                poVar6 = this->_stderr;
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Error: Benchmarks ",0x12)
                ;
                pcVar3 = *(char **)p_Var4;
                if (pcVar3 == (char *)0x0) {
                  std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar5 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," and ",5);
                pcVar3 = *(char **)p_Var10;
                if (pcVar3 == (char *)0x0) {
                  std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar5 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," @",2);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,p_Var7[1]._M_color);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," produce different results: ",0x1c);
                poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," and ",5);
                poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                local_a9 = '\n';
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_a9,1);
                this->_error = error_benchmark_compare;
              }
              p_Var10 = p_Var10 + 1;
            } while (p_Var10 != p_Var11);
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
        ::~_Rb_tree(&local_88);
        local_98 = (pointer)((long)local_98 + 0x20);
      } while (local_98 != (pointer)local_90);
    }
  }
  return local_a0;
}

Assistant:

report generate_report(CompareResult cmp = std::equal_to<result_t>()) const
    {
        report rpt;

        rpt.suites.resize(_suites.size());
        auto rpt_suite = rpt.suites.begin();

        for (auto& suite : _suites)
        {
            rpt_suite->name = suite.name;

            // build benchmark view
            rpt_suite->benchmarks.resize(suite.benchmarks.size());
            auto rpt_benchmark = rpt_suite->benchmarks.begin();

            for (auto& b : suite.benchmarks)
            {
                rpt_benchmark->name = b->_name;
                rpt_benchmark->is_baseline = b->_baseline;

                const std::vector<int>& state_iterations =
                    b->_state_iterations.empty() ?
                    _default_state_iterations :
                    b->_state_iterations;

                rpt_benchmark->data.reserve(state_iterations.size());
                for (auto d : state_iterations)
                {
                    rpt_benchmark->data.push_back({ d, 0, 0ll });
                }

                for (auto& state : b->_states)
                {
                    for (auto& d : rpt_benchmark->data)
                    {
                        if (state.iterations() == d.dimension)
                        {
                            if (d.total_time_ns == 0 || d.total_time_ns > state.duration_ns())
                            {
                                d.total_time_ns = state.duration_ns();
                                d.result = state.result();
                            }

                            if (_compare_results_across_samples)
                            {
                                if (d.result != state.result() && !cmp(d.result, state.result()))
                                {
                                    *_stderr << "Error: Two samples of " << b->name() << " @" << d.dimension << " produced different results: "
                                             << d.result << " and " << state.result() << '\n';
                                    _error = error_sample_compare;
                                }
                            }

                            ++d.samples;
                        }
                    }
                }

#if defined(PICOBENCH_DEBUG)
                for (auto& d : rpt_benchmark->data)
                {
                    I_PICOBENCH_ASSERT(d.samples == b->_samples);
                }
#endif

                ++rpt_benchmark;
            }

            ++rpt_suite;
        }

        if (_compare_results_across_benchmarks)
        {
            for(auto& suite : rpt.suites)
            {
                auto psview = report::get_problem_space_view(suite);

                for (auto& space : psview)
                {
                    I_PICOBENCH_ASSERT(!space.second.empty());

                    if (space.second.size() == 1)
                    {
                        auto& b = space.second.front();
                        *_stdwarn << "Warning: Benchmark " << b.name << " @" << space.first
                                  << " has a single instance and cannot be compared to others.\n";
                        continue;
                    }

                    auto result0 = space.second.front().result;

                    for (auto& b : space.second)
                    {
                        if (result0 != b.result && !cmp(result0, b.result))
                        {
                            auto& f = space.second.front();
                            *_stderr << "Error: Benchmarks " << f.name << " and " << b.name
                                     << " @" << space.first << " produce different results: "
                                     << result0 << " and " << b.result << '\n';
                            _error = error_benchmark_compare;
                        }
                    }
                }
            }
        }

        return rpt;
    }